

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIHexDecoder::decode(FIHexDecoder *this,uint8_t *data,size_t len)

{
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<Assimp::FIHexValue> sVar2;
  shared_ptr<const_Assimp::FIValue> sVar3;
  allocator_type local_41;
  void *local_40 [2];
  long local_30;
  FIValue local_28;
  FIHexDecoder FStack_20;
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,(uchar *)len,
             (uchar *)(in_RCX + len),&local_41);
  sVar2 = FIHexValue::create((FIHexValue *)&local_28,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  _Var1 = sVar2.super___shared_ptr<Assimp::FIHexValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  *this = (FIHexDecoder)local_28._vptr_FIValue;
  this[1] = FStack_20;
  if (local_40[0] != (void *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
    _Var1._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FIHexValue::create(std::vector<uint8_t>(data, data + len));
    }